

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O3

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  Geometry *pGVar7;
  BVH *pBVar8;
  ThreadLocal2 *this_00;
  iterator __position;
  BuildRef *pBVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  ThreadLocal2 *this_01;
  ulong uVar12;
  undefined8 *puVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  Geometry *geometry;
  undefined1 auVar20 [32];
  Lock<embree::MutexSys> lock;
  PrimInfo pinfo;
  undefined8 *local_100;
  undefined1 local_f8;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_f0;
  char local_e8;
  __pointer_type local_e0;
  undefined8 *local_d8;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *local_d0;
  mvector<PrimRef> local_c8;
  RefBuilderSmall *local_a0;
  long *local_98;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined1 local_78 [16];
  long local_48;
  long local_40;
  
  sVar18 = this->objectID_;
  pGVar7 = (topBuilder->scene->geometries).items[sVar18].ptr;
  if (pGVar7 == (Geometry *)0x0) {
    geometry = (Geometry *)0x0;
  }
  else {
    geometry = (Geometry *)0x0;
    if (0x1d < ((uint)pGVar7->field_8 & 0xfe)) {
      geometry = pGVar7;
    }
  }
  uVar6 = geometry->numPrimitives;
  uVar15 = (ulong)uVar6;
  lVar19 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_c8.alloc.device = (MemoryMonitorInterface *)(lVar19 + 0x550);
  if (lVar19 == 0) {
    local_c8.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_c8.alloc.hugepages = false;
  local_c8.size_active = 0;
  local_c8.size_alloced = 0;
  local_c8.items = (PrimRef *)0x0;
  local_a0 = this;
  if (uVar15 != 0) {
    sVar18 = uVar15 << 5;
    (**(local_c8.alloc.device)->_vptr_MemoryMonitorInterface)(local_c8.alloc.device,sVar18,0);
    if (uVar6 < 0xe0000) {
      local_c8.items = (PrimRef *)alignedMalloc(sVar18,0x20);
    }
    else {
      local_c8.items = (PrimRef *)os_malloc(sVar18,&local_c8.alloc.hugepages);
    }
    sVar18 = local_a0->objectID_;
    local_c8.size_alloced = uVar15;
  }
  local_c8.size_active = local_c8.size_alloced;
  avx::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,geometry,(uint)sVar18,uVar15,&local_c8,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    lVar19 = 0xc;
    local_98 = (long *)__tls_get_addr(&PTR_021a7d38);
    uVar15 = 0;
    local_d0 = topBuilder;
    do {
      pBVar8 = local_d0->bvh;
      this_01 = (ThreadLocal2 *)*local_98;
      if (this_01 == (ThreadLocal2 *)0x0) {
        this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys((MutexSys *)this_01);
        (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
        (this_01->alloc0).parent = this_01;
        auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
        (this_01->alloc0).ptr = (char *)auVar20._0_8_;
        (this_01->alloc0).cur = auVar20._8_8_;
        (this_01->alloc0).end = auVar20._16_8_;
        (this_01->alloc0).allocBlockSize = auVar20._24_8_;
        (this_01->alloc0).end = auVar20._0_8_;
        (this_01->alloc0).allocBlockSize = auVar20._8_8_;
        (this_01->alloc0).bytesUsed = auVar20._16_8_;
        (this_01->alloc0).bytesWasted = auVar20._24_8_;
        (this_01->alloc1).parent = this_01;
        auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
        (this_01->alloc1).ptr = (char *)auVar20._0_8_;
        (this_01->alloc1).cur = auVar20._8_8_;
        (this_01->alloc1).end = auVar20._16_8_;
        (this_01->alloc1).allocBlockSize = auVar20._24_8_;
        (this_01->alloc1).end = auVar20._0_8_;
        (this_01->alloc1).allocBlockSize = auVar20._8_8_;
        (this_01->alloc1).bytesUsed = auVar20._16_8_;
        (this_01->alloc1).bytesWasted = auVar20._24_8_;
        *local_98 = (long)this_01;
        local_100 = &FastAllocator::s_thread_local_allocators_lock;
        local_f8 = 1;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_f0._M_head_impl = this_01;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)&local_f0);
        if (local_f0._M_head_impl != (ThreadLocal2 *)0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_f0,
                     local_f0._M_head_impl);
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      }
      local_e0 = &pBVar8->alloc;
      uVar16 = (ulong)(((pBVar8->alloc).use_single_mode ^ 1) << 6);
      local_d8 = (undefined8 *)0x10;
      this_00 = *(ThreadLocal2 **)((long)&(this_01->alloc0).parent + uVar16);
      if (local_e0 != (this_00->alloc)._M_b._M_p) {
        local_e8 = '\x01';
        local_f0._M_head_impl = this_00;
        MutexSys::lock(&this_00->mutex);
        if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
          UNLOCK();
          LOCK();
          paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (((this_00->alloc0).end + (this_00->alloc1).end) -
               ((this_00->alloc0).cur + (this_00->alloc1).cur));
          UNLOCK();
          LOCK();
          paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
          UNLOCK();
        }
        auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
        (this_00->alloc0).end = auVar20._0_8_;
        (this_00->alloc0).allocBlockSize = auVar20._8_8_;
        (this_00->alloc0).bytesUsed = auVar20._16_8_;
        (this_00->alloc0).bytesWasted = auVar20._24_8_;
        (this_00->alloc0).ptr = (char *)auVar20._0_8_;
        (this_00->alloc0).cur = auVar20._8_8_;
        (this_00->alloc0).end = auVar20._16_8_;
        (this_00->alloc0).allocBlockSize = auVar20._24_8_;
        (this_00->alloc0).allocBlockSize = (pBVar8->alloc).defaultBlockSize;
        auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
        (this_00->alloc1).ptr = (char *)auVar20._0_8_;
        (this_00->alloc1).cur = auVar20._8_8_;
        (this_00->alloc1).end = auVar20._16_8_;
        (this_00->alloc1).allocBlockSize = auVar20._24_8_;
        (this_00->alloc1).end = auVar20._0_8_;
        (this_00->alloc1).allocBlockSize = auVar20._8_8_;
        (this_00->alloc1).bytesUsed = auVar20._16_8_;
        (this_00->alloc1).bytesWasted = auVar20._24_8_;
        (this_00->alloc1).allocBlockSize = (pBVar8->alloc).defaultBlockSize;
        LOCK();
        (this_00->alloc)._M_b._M_p = local_e0;
        UNLOCK();
        local_100 = &FastAllocator::s_thread_local_allocators_lock;
        local_f8 = 1;
        local_90._M_head_impl = this_00;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar8->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar8->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar8->alloc).thread_local_allocators,__position,&local_90._M_head_impl);
        }
        else {
          *__position._M_current = local_90._M_head_impl;
          pppTVar2 = &(pBVar8->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        if (local_e8 == '\x01') {
          MutexSys::unlock(&(local_f0._M_head_impl)->mutex);
        }
      }
      plVar4 = (long *)((long)&(this_01->alloc0).bytesUsed + uVar16);
      *plVar4 = *plVar4 + (long)local_d8;
      lVar14 = *(long *)((long)&(this_01->alloc0).cur + uVar16);
      uVar17 = (ulong)(-(int)lVar14 & 0xf);
      uVar12 = (long)local_d8 + uVar17 + lVar14;
      *(ulong *)((long)&(this_01->alloc0).cur + uVar16) = uVar12;
      if (*(ulong *)((long)&(this_01->alloc0).end + uVar16) < uVar12) {
        *(long *)((long)&(this_01->alloc0).cur + uVar16) = lVar14;
        puVar13 = *(undefined8 **)((long)&(this_01->alloc0).allocBlockSize + uVar16);
        if (puVar13 < (undefined8 *)((long)local_d8 << 2)) {
          puVar13 = (undefined8 *)FastAllocator::malloc(local_e0,(size_t)&local_d8);
        }
        else {
          local_100 = puVar13;
          puVar13 = (undefined8 *)FastAllocator::malloc(local_e0,(size_t)&local_100);
          *(undefined8 **)((long)&(this_01->alloc0).ptr + uVar16) = puVar13;
          lVar14 = (*(long *)((long)&(this_01->alloc0).end + uVar16) -
                   *(long *)((long)&(this_01->alloc0).cur + uVar16)) +
                   *(long *)((long)&(this_01->alloc0).bytesWasted + uVar16);
          *(long *)((long)&(this_01->alloc0).bytesWasted + uVar16) = lVar14;
          *(undefined8 *)((long)&(this_01->alloc0).cur + uVar16) = 0;
          *(undefined8 **)((long)&(this_01->alloc0).end + uVar16) = local_100;
          *(undefined8 **)((long)&(this_01->alloc0).cur + uVar16) = local_d8;
          if (local_100 < local_d8) {
            *(undefined8 *)((long)&(this_01->alloc0).cur + uVar16) = 0;
            local_100 = *(undefined8 **)((long)&(this_01->alloc0).allocBlockSize + uVar16);
            puVar13 = (undefined8 *)FastAllocator::malloc(local_e0,(size_t)&local_100);
            *(undefined8 **)((long)&(this_01->alloc0).ptr + uVar16) = puVar13;
            lVar14 = (*(long *)((long)&(this_01->alloc0).end + uVar16) -
                     *(long *)((long)&(this_01->alloc0).cur + uVar16)) +
                     *(long *)((long)&(this_01->alloc0).bytesWasted + uVar16);
            *(long *)((long)&(this_01->alloc0).bytesWasted + uVar16) = lVar14;
            *(undefined8 *)((long)&(this_01->alloc0).cur + uVar16) = 0;
            *(undefined8 **)((long)&(this_01->alloc0).end + uVar16) = local_100;
            *(undefined8 **)((long)&(this_01->alloc0).cur + uVar16) = local_d8;
            if (local_100 < local_d8) {
              *(undefined8 *)((long)&(this_01->alloc0).cur + uVar16) = 0;
              puVar13 = (undefined8 *)0x0;
              goto LAB_0143babf;
            }
          }
          *(long *)((long)&(this_01->alloc0).bytesWasted + uVar16) = lVar14;
        }
      }
      else {
        plVar4 = (long *)((long)&(this_01->alloc0).bytesWasted + uVar16);
        *plVar4 = *plVar4 + uVar17;
        puVar13 = (undefined8 *)
                  ((uVar12 - (long)local_d8) + *(long *)((long)&(this_01->alloc0).ptr + uVar16));
      }
LAB_0143babf:
      uVar15 = uVar15 + 1;
      uVar6 = *(uint *)((long)&((local_c8.items)->lower).field_0 + lVar19);
      *puVar13 = (local_d0->bvh->scene->geometries).items[uVar6].ptr;
      *(uint *)(puVar13 + 1) = uVar6;
      aVar10.m128 = (__m128)vinsertps_avx(local_88.m128,ZEXT416((uint)local_a0->objectID_),0x30);
      aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_78,ZEXT416(1),0x30);
      LOCK();
      paVar3 = &local_d0->nextRef;
      iVar5 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar9 = (local_d0->refs).items;
      pBVar9[iVar5].super_PrimRef.upper.field_0 = aVar11;
      pBVar9[iVar5].super_PrimRef.lower.field_0 = aVar10;
      pBVar9[iVar5].node.ptr = (ulong)puVar13 | 9;
      pBVar9[iVar5].bounds_area = 0.0;
      lVar19 = lVar19 + 0x20;
    } while (uVar15 < (ulong)(local_40 - local_48));
  }
  sVar18 = local_c8.size_alloced;
  if (local_c8.items != (PrimRef *)0x0) {
    if (local_c8.size_alloced << 5 < 0x1c00000) {
      alignedFree(local_c8.items);
    }
    else {
      os_free(local_c8.items,local_c8.size_alloced << 5,local_c8.alloc.hugepages);
    }
  }
  if (sVar18 != 0) {
    (**(local_c8.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_c8.alloc.device,sVar18 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }